

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

ON_ClippingPlaneData *
GetClippingPlaneData(ON_ClippingPlaneDataStore *dataStore,bool createIfMissing)

{
  bool bVar1;
  ON_ClippingPlaneData *local_20;
  ON_ClippingPlaneData *rc;
  bool bReturnLock;
  bool createIfMissing_local;
  ON_ClippingPlaneDataStore *dataStore_local;
  
  bVar1 = ON_SleepLock::GetLock(&g_data_list_lock);
  local_20 = ON_ClippingPlaneDataList::FromSerialNumber(&g_data_list,dataStore->m_sn);
  if (((local_20 == (ON_ClippingPlaneData *)0x0) && (createIfMissing)) &&
     (local_20 = ON_ClippingPlaneDataList::AppendNew(&g_data_list),
     local_20 != (ON_ClippingPlaneData *)0x0)) {
    dataStore->m_sn = local_20->m_sn;
  }
  if (bVar1) {
    ON_SleepLock::ReturnLock(&g_data_list_lock);
  }
  return local_20;
}

Assistant:

static ON_ClippingPlaneData* GetClippingPlaneData(ON_ClippingPlaneDataStore& dataStore, bool createIfMissing)
{
  bool bReturnLock = g_data_list_lock.GetLock();

  ON_ClippingPlaneData* rc = g_data_list.FromSerialNumber(dataStore.m_sn);
  if (nullptr==rc && createIfMissing)
  {
    rc = g_data_list.AppendNew();
    if (rc)
      dataStore.m_sn = rc->m_sn;
  }
  if(bReturnLock)
    g_data_list_lock.ReturnLock();
  return rc;
}